

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunadaptcontroller_imexgus.c
# Opt level: O2

SUNErrCode
SUNAdaptController_EstimateStep_ImExGus
          (SUNAdaptController C,sunrealtype h,int p,sunrealtype dsm,sunrealtype *hnew)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  ulong *puVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  ulong uVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double local_78;
  undefined4 local_48;
  undefined4 local_38;
  undefined4 local_28;
  undefined4 local_18;
  
  dVar13 = (double)(p + 1);
  puVar6 = (ulong *)C->content;
  dVar14 = dsm * (double)puVar6[4];
  if (dVar14 <= 1e-10) {
    dVar14 = 1e-10;
  }
  if ((int)puVar6[7] == 0) {
    uVar11 = (ulong)DAT_00158590;
    uVar1 = *puVar6;
    uVar2 = puVar6[1];
    uVar3 = puVar6[2];
    uVar4 = puVar6[3];
    dVar12 = (double)puVar6[5];
    if (dVar12 <= 1e-10) {
      dVar12 = 1e-10;
    }
    dVar12 = dVar14 / dVar12;
    dVar5 = (double)puVar6[6];
    dVar7 = (double)SUNRpowerR(dVar14);
    local_28 = SUB84((double)(uVar2 ^ uVar11) / dVar13,0);
    dVar8 = (double)SUNRpowerR(dVar12,local_28);
    local_48 = SUB84((double)(uVar3 ^ uVar11) / dVar13,0);
    dVar9 = (double)SUNRpowerR(dVar14,local_48);
    local_38 = SUB84((double)(uVar4 ^ uVar11) / dVar13,0);
    dVar10 = (double)SUNRpowerR(dVar12,local_38);
    if (dVar10 * dVar9 <= dVar8 * dVar7 * (h / dVar5)) {
      local_78 = (double)SUNRpowerR(dVar14,local_48);
      local_28 = local_38;
    }
    else {
      local_18 = SUB84((double)(uVar1 ^ uVar11) / dVar13,0);
      local_78 = (double)SUNRpowerR(dVar14,local_18);
      local_78 = (h / dVar5) * local_78;
    }
    dVar13 = (double)SUNRpowerR(dVar12,local_28);
    dVar13 = dVar13 * local_78;
  }
  else {
    dVar13 = (double)SUNRpowerR(dVar14,SUB84(-1.0 / dVar13,0));
  }
  *hnew = dVar13 * h;
  return 0;
}

Assistant:

SUNErrCode SUNAdaptController_EstimateStep_ImExGus(SUNAdaptController C,
                                                   sunrealtype h, int p,
                                                   sunrealtype dsm,
                                                   sunrealtype* hnew)
{
  SUNFunctionBegin(C->sunctx);

  SUNAssert(hnew, SUN_ERR_ARG_CORRUPT);

  /* order parameter to use */
  const int ord = p + 1;

  /* set usable time-step adaptivity parameters -- first step */
  const sunrealtype k = -SUN_RCONST(1.0) / ord;
  const sunrealtype e = SUNMAX(SACIMEXGUS_BIAS(C) * dsm, TINY);

  /* set usable time-step adaptivity parameters -- subsequent steps */
  const sunrealtype k1e  = -SACIMEXGUS_K1E(C) / ord;
  const sunrealtype k2e  = -SACIMEXGUS_K2E(C) / ord;
  const sunrealtype k1i  = -SACIMEXGUS_K1I(C) / ord;
  const sunrealtype k2i  = -SACIMEXGUS_K2I(C) / ord;
  const sunrealtype e1   = SUNMAX(SACIMEXGUS_BIAS(C) * dsm, TINY);
  const sunrealtype e2   = e1 / SUNMAX(SACIMEXGUS_EP(C), TINY);
  const sunrealtype hrat = h / SACIMEXGUS_HP(C);

  /* compute estimated time step size, modifying the first step formula */
  if (SACIMEXGUS_FIRSTSTEP(C)) { *hnew = h * SUNRpowerR(e, k); }
  else
  {
    *hnew = h * SUNMIN(hrat * SUNRpowerR(e1, k1i) * SUNRpowerR(e2, k2i),
                       SUNRpowerR(e1, k1e) * SUNRpowerR(e2, k2e));
  }

  /* return with success */
  return SUN_SUCCESS;
}